

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

PVG_FT_Long PVG_FT_DivFix(PVG_FT_Long a,PVG_FT_Long b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (b == 0) {
    uVar1 = 0x7fffffff;
  }
  else {
    uVar1 = -b;
    if (0 < b) {
      uVar1 = b;
    }
    lVar3 = -a;
    if (0 < a) {
      lVar3 = a;
    }
    uVar1 = ((uVar1 >> 1) + lVar3 * 0x10000) / uVar1;
  }
  uVar2 = -uVar1;
  if (-1 < (b ^ a)) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

PVG_FT_Long PVG_FT_DivFix(PVG_FT_Long a, PVG_FT_Long b)
{
    PVG_FT_Int  s = 1;
    PVG_FT_Long q;

    PVG_FT_MOVE_SIGN(a, s);
    PVG_FT_MOVE_SIGN(b, s);

    q = (PVG_FT_Long)(b > 0 ? (((PVG_FT_UInt64)a << 16) + (b >> 1)) / b
                           : 0x7FFFFFFFL);

    return (s < 0 ? -q : q);
}